

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O0

double __thiscall
trento::DeformedWoodsSaxonNucleus::deformed_woods_saxon_dist
          (DeformedWoodsSaxonNucleus *this,double r,double cos_theta)

{
  long in_RDI;
  double in_XMM0_Qa;
  __type _Var1;
  double dVar2;
  undefined1 auVar3 [16];
  double in_XMM1_Qa;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double Reff;
  double Y40;
  double Y20;
  double cos_theta_sq;
  
  dVar2 = in_XMM1_Qa * in_XMM1_Qa;
  _Var1 = std::sqrt<int>(0);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar2;
  auVar7 = vfmadd213sd_fma(ZEXT816(0x4008000000000000),auVar7,ZEXT816(0xbff0000000000000));
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar2;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar2 * 35.0;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = -(dVar2 * 30.0);
  auVar3 = vfmadd213sd_fma(auVar3,auVar4,auVar8);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(in_RDI + 0x40);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = (_Var1 / 4.0) * 0.5641895835477563 * auVar7._0_8_;
  auVar7 = vfmadd213sd_fma(auVar10,auVar5,ZEXT816(0x3ff0000000000000));
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(in_RDI + 0x48);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (auVar3._0_8_ + 3.0) * 0.10578554691520431;
  auVar7 = vfmadd213sd_fma(auVar6,auVar9,auVar7);
  dVar2 = exp((in_XMM0_Qa - *(double *)(in_RDI + 0x30) * auVar7._0_8_) / *(double *)(in_RDI + 0x38))
  ;
  return 1.0 / (dVar2 + 1.0);
}

Assistant:

double DeformedWoodsSaxonNucleus::deformed_woods_saxon_dist(
    double r, double cos_theta) const {
  auto cos_theta_sq = cos_theta*cos_theta;

  // spherical harmonics
  using math::double_constants::one_div_root_pi;
  auto Y20 = std::sqrt(5)/4. * one_div_root_pi * (3.*cos_theta_sq - 1.);
  auto Y40 = 3./16. * one_div_root_pi *
             (35.*cos_theta_sq*cos_theta_sq - 30.*cos_theta_sq + 3.);

  // "effective" radius
  auto Reff = R_ * (1. + beta2_*Y20 + beta4_*Y40);

  return 1. / (1. + std::exp((r - Reff) / a_));
}